

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMatterMeshless::UpdateParticleCollisionModels(ChMatterMeshless *this)

{
  pointer psVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar3)
    break;
    (**(code **)((long)(psVar1[uVar3].
                        super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->collision_model->_vptr_ChCollisionModel + 0x18))();
    (**(code **)((long)((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar3].
                        super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->collision_model->_vptr_ChCollisionModel + 0x20))();
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void ChMatterMeshless::UpdateParticleCollisionModels() {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->collision_model->ClearModel();
        //***TO DO*** UPDATE RADIUS OF MeshlessERE?
        // nodes[j]->collision_model->AddCopyOfAnotherModel(particle_collision_model);
        nodes[j]->collision_model->BuildModel();
    }
}